

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O2

void __thiscall
supermap::BloomFilter<supermap::Key<128UL>_>::BloomFilter
          (BloomFilter<supermap::Key<128UL>_> *this,double errorProbability,
          unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *hasher)

{
  result_type *prVar1;
  uint uVar2;
  result_type rVar3;
  IllegalArgumentException *this_00;
  unsigned_long *seed;
  result_type *prVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  double dVar5;
  random_device local_1d80;
  mt19937_64 rnd;
  
  (this->super_Filter<supermap::Key<128UL>_>).
  super_Cloneable<supermap::Filter<supermap::Key<128UL>_>_>._vptr_Cloneable =
       (_func_int **)&PTR_clone_001f8c50;
  (this->hasher_)._M_t.
  super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
  super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
  super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl =
       (hasher->_M_t).
       super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
       super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
       super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl;
  (hasher->_M_t).super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>.
  _M_t.super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
  super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl = (Hasher *)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->wasReserved_ = false;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  if ((0.0 < errorProbability) && (errorProbability <= 1.0)) {
    dVar5 = log2(errorProbability);
    dVar5 = dVar5 * -1.44;
    if (dVar5 <= 1.0) {
      dVar5 = 1.0;
    }
    this->sizeMultiplier_ = dVar5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->seeds_,7);
    std::random_device::random_device(&local_1d80);
    uVar2 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed(&rnd,(ulong)uVar2);
    std::random_device::~random_device(&local_1d80);
    prVar1 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (prVar4 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start; prVar4 != prVar1; prVar4 = prVar4 + 1) {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()(&rnd);
      *prVar4 = rVar3;
    }
    return;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d80,"Error probability must be a positive number not bigger than 1",
             (allocator<char> *)&rnd);
  supermap::IllegalArgumentException::IllegalArgumentException(this_00,(string *)&local_1d80);
  __cxa_throw(this_00,&IllegalArgumentException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

explicit BloomFilter(double errorProbability, std::unique_ptr<Hasher> &&hasher) : hasher_(std::move(hasher)) {
        if (errorProbability <= 0 || errorProbability > 1) {
            throw supermap::IllegalArgumentException("Error probability must be a positive number not bigger than 1");
        }
        sizeMultiplier_ = std::max(1.0, -1.44 * std::log2(errorProbability));
        constexpr std::size_t keysSize = io::FixedDeserializedSizeRegister<T>::exactDeserializedSize;
        auto numberOfHashFunctions = std::max(1ul, static_cast<std::size_t>(std::ceil(std::log2(keysSize))));
        seeds_.resize(numberOfHashFunctions);
        std::mt19937_64 rnd(std::random_device{}());
        for (auto &seed : seeds_) {
            seed = rnd();
        }
    }